

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O2

void __thiscall
Text::Text(Text *this,FontFace face_,string *text_,FontColor color_,float x_,float y_,float z_,
          float windowScale_,float scale_,float kerning_)

{
  FontColor *pFVar1;
  
  this->x = 0.0;
  this->y = 0.0;
  this->z = 0.0;
  this->windowScale = 1.0;
  this->rotationX = 0.0;
  this->rotationY = 0.0;
  this->scale = 1.0;
  this->kerning = 0.0;
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  (this->text)._M_string_length = 0;
  (this->text).field_2._M_local_buf[0] = '\0';
  pFVar1 = &this->_color;
  this->color = pFVar1;
  this->texture = &this->_texture;
  (this->_font).tex_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_font).tex_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_font).tex_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_font).glyphs.super__Vector_base<texture_glyph_t,_std::allocator<texture_glyph_t>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_font).glyphs.super__Vector_base<texture_glyph_t,_std::allocator<texture_glyph_t>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_font).glyphs.super__Vector_base<texture_glyph_t,_std::allocator<texture_glyph_t>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_texture).id = 0;
  (this->_texture)._width = 0;
  (this->_texture)._height = 0;
  if (face_ < (arial_32|arial_28)) {
    texture_font_t::operator=(&this->_font,(texture_font_t *)(&PTR_arial_16pt_00194bc0)[face_]);
    pFVar1->r = (char)color_._0_2_;
    pFVar1->g = (char)((ushort)color_._0_2_ >> 8);
    (this->_color).b = color_.b;
    std::__cxx11::string::_M_assign((string *)&this->text);
    this->x = x_;
    this->y = y_;
    this->z = z_;
    this->windowScale = windowScale_;
    this->scale = scale_;
    this->kerning = kerning_;
    return;
  }
  printf("Unsupported font type");
  putchar(10);
  fflush(_stdout);
  exit(1);
}

Assistant:

Text::Text(FontFace face_, std::string text_, FontColor color_, float x_, float y_, float z_, float windowScale_, float scale_, float kerning_) {
    switch(face_) {
    case FontFace::arial_16:  _font = arial_16pt; break;
    case FontFace::arial_28:  _font = arial_28pt; break;
    case FontFace::arial_32:  _font = arial_32pt; break;
    default:
        DEBUG_PRINTLN("Unsupported font type");
        exit(EXIT_FAILURE);
    }

    _color = color_;
    text = text_;
    x = x_;
    y = y_;
    z = z_;
    windowScale = windowScale_;
    scale = scale_;
    kerning = kerning_;
}